

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void fill_MPP_FMT_YUV420SP
               (RK_U8 *buf,RK_U32 width,RK_U32 height,RK_U32 hor_stride,RK_U32 ver_stride,
               RK_U32 frame_count)

{
  uint local_38;
  uint local_34;
  RK_U32 y;
  RK_U32 x;
  RK_U8 *p;
  RK_U32 frame_count_local;
  RK_U32 ver_stride_local;
  RK_U32 hor_stride_local;
  RK_U32 height_local;
  RK_U32 width_local;
  RK_U8 *buf_local;
  
  _y = buf;
  for (local_38 = 0; local_38 < height; local_38 = local_38 + 1) {
    for (local_34 = 0; local_34 < width; local_34 = local_34 + 1) {
      _y[local_34] = (char)local_34 + (char)local_38 + (char)frame_count * '\x03';
    }
    _y = _y + hor_stride;
  }
  _y = buf + hor_stride * ver_stride;
  for (local_38 = 0; local_38 < height >> 1; local_38 = local_38 + 1) {
    for (local_34 = 0; local_34 < width >> 1; local_34 = local_34 + 1) {
      _y[local_34 << 1] = (char)local_38 + -0x80 + (char)(frame_count << 1);
      _y[local_34 * 2 + 1] = (char)local_34 + '@' + (char)frame_count * '\x05';
    }
    _y = _y + hor_stride;
  }
  return;
}

Assistant:

static void fill_MPP_FMT_YUV420SP(RK_U8 *buf, RK_U32 width, RK_U32 height,
                                  RK_U32 hor_stride, RK_U32 ver_stride,
                                  RK_U32 frame_count)
{
    // MPP_FMT_YUV420SP = ffmpeg: nv12
    // https://www.fourcc.org/pixel-format/yuv-nv12/
    RK_U8 *p = buf;
    RK_U32 x, y;

    for (y = 0; y < height; y++, p += hor_stride) {
        for (x = 0; x < width; x++) {
            p[x] = x + y + frame_count * 3;
        }
    }

    p = buf + hor_stride * ver_stride;
    for (y = 0; y < height / 2; y++, p += hor_stride) {
        for (x = 0; x < width / 2; x++) {
            p[x * 2 + 0] = 128 + y + frame_count * 2;
            p[x * 2 + 1] = 64  + x + frame_count * 5;
        }
    }
}